

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alloc.h
# Opt level: O0

void __thiscall
Glucose::RegionAllocator<unsigned_int>::moveTo
          (RegionAllocator<unsigned_int> *this,RegionAllocator<unsigned_int> *to)

{
  long *in_RSI;
  long *in_RDI;
  
  if (*in_RSI != 0) {
    ::free((void *)*in_RSI);
  }
  *in_RSI = *in_RDI;
  *(int *)(in_RSI + 1) = (int)in_RDI[1];
  *(undefined4 *)((long)in_RSI + 0xc) = *(undefined4 *)((long)in_RDI + 0xc);
  *(int *)(in_RSI + 2) = (int)in_RDI[2];
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  return;
}

Assistant:

void     moveTo(RegionAllocator& to) {
        if (to.memory != NULL) ::free(to.memory);
        to.memory = memory;
        to.sz = sz;
        to.cap = cap;
        to.wasted_ = wasted_;

        memory = NULL;
        sz = cap = wasted_ = 0;
    }